

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int run_container_index_equalorlarger(run_container_t *arr,uint16_t x)

{
  int iVar1;
  rle16_t *prVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = arr->n_runs;
  if (0 < iVar1) {
    prVar2 = arr->runs;
    iVar5 = iVar1 + -1;
    iVar4 = 0;
    do {
      uVar3 = (uint)(iVar5 + iVar4) >> 1;
      if (prVar2[uVar3].value < x) {
        iVar4 = uVar3 + 1;
      }
      else {
        if (prVar2[uVar3].value <= x) {
          return uVar3;
        }
        iVar5 = uVar3 - 1;
      }
    } while (iVar4 <= iVar5);
    if (iVar4 != 0) {
      uVar3 = iVar4 - 1;
      if ((int)((uint)x - (uint)prVar2[uVar3].value) <= (int)(uint)prVar2[uVar3].length) {
        return uVar3;
      }
      goto LAB_001123a2;
    }
  }
  iVar4 = 0;
LAB_001123a2:
  iVar5 = -1;
  if (iVar4 < iVar1) {
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

inline int run_container_index_equalorlarger(const run_container_t *arr,
                                             uint16_t x) {
    int32_t index = interleavedBinarySearch(arr->runs, arr->n_runs, x);
    if (index >= 0) return index;
    index = -index - 2;  // points to preceding run, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = x - arr->runs[index].value;
        int32_t le = arr->runs[index].length;
        if (offset <= le) return index;
    }
    index += 1;
    if (index < arr->n_runs) {
        return index;
    }
    return -1;
}